

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_eval.h
# Opt level: O2

void __thiscall
embree::sse2::PatchEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::PatchEval
          (PatchEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *this,CacheEntry *entry,
          size_t commitCounter,HalfEdge *edge,char *vertices,size_t stride,float u,float v,
          vfloat_impl<4> *P,vfloat_impl<4> *dPdu,vfloat_impl<4> *dPdv,vfloat_impl<4> *ddPdudu,
          vfloat_impl<4> *ddPdvdv,vfloat_impl<4> *ddPdudv)

{
  SpinLock *this_00;
  long lVar1;
  bool bVar2;
  long *plVar3;
  long *plVar4;
  Ref This;
  long lVar5;
  int iVar6;
  ThreadWorkState *t_state;
  ulong uVar7;
  bool local_b1;
  float v_local;
  float u_local;
  long *local_a8;
  PatchEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *local_a0;
  long local_98;
  size_t stride_local;
  char *vertices_local;
  HalfEdge *edge_local;
  anon_class_24_3_bdfbcaa4 local_78;
  FeatureAdaptiveEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> local_60;
  
  local_78.edge = &edge_local;
  local_78.vertices = &vertices_local;
  local_78.stride = &stride_local;
  this->P = P;
  this->dPdu = dPdu;
  this->dPdv = dPdv;
  this->ddPdudu = ddPdudu;
  this->ddPdvdv = ddPdvdv;
  this->ddPdudv = ddPdudv;
  local_98 = DAT_0220a4c0;
  v_local = v;
  u_local = u;
  local_a0 = this;
  stride_local = stride;
  vertices_local = vertices;
  edge_local = edge;
  local_a8 = (long *)__tls_get_addr(&PTR_021f8148);
  t_state = (ThreadWorkState *)*local_a8;
  if (t_state == (ThreadWorkState *)0x0) {
    SharedLazyTessellationCache::getNextRenderThreadWorkState
              ((SharedLazyTessellationCache *)
               &SharedLazyTessellationCache::sharedLazyTessellationCache);
    t_state = (ThreadWorkState *)*local_a8;
  }
  lVar5 = commitCounter * 8;
  this_00 = &entry->mutex;
  do {
    while( true ) {
      LOCK();
      uVar7 = (t_state->counter).super___atomic_base<unsigned_long>._M_i;
      (t_state->counter).super___atomic_base<unsigned_long>._M_i =
           (t_state->counter).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
      if (uVar7 < 4) break;
      LOCK();
      (t_state->counter).super___atomic_base<unsigned_long>._M_i =
           (t_state->counter).super___atomic_base<unsigned_long>._M_i - 1;
      UNLOCK();
      SharedLazyTessellationCache::waitForUsersLessEqual
                ((SharedLazyTessellationCache *)
                 &SharedLazyTessellationCache::sharedLazyTessellationCache,t_state,0);
    }
    uVar7 = (entry->tag).data.super_atomic<long>.super___atomic_base<long>._M_i;
    if ((uVar7 != 0) &&
       (This.ptr = (uVar7 & 0xffffffffff) + SharedLazyTessellationCache::sharedLazyTessellationCache
       , This.ptr != 0 && (ulong)(DAT_0220a4c0 + lVar5) <= ((long)uVar7 >> 0x28) + 7U))
    goto LAB_005b2c83;
    local_b1 = false;
    if ((((this_00->flag).super_atomic<bool>._M_base._M_i & 1U) == 0) &&
       (bVar2 = std::atomic<bool>::compare_exchange_strong
                          ((atomic<bool> *)this_00,&local_b1,true,memory_order_acquire), bVar2)) {
      lVar1 = (entry->tag).data.super_atomic<long>.super___atomic_base<long>._M_i;
      if ((lVar1 == 0) || ((lVar1 >> 0x28) + 7U < (ulong)(DAT_0220a4c0 + lVar5))) {
        iVar6 = (int)DAT_0220a4c0;
        This = PatchEval::anon_class_24_3_bdfbcaa4::operator()(&local_78);
        uVar7 = (ulong)(uint)(iVar6 + (int)lVar5) << 0x28 |
                This.ptr - SharedLazyTessellationCache::sharedLazyTessellationCache;
        if (This.ptr == 0) {
          uVar7 = 0;
        }
        LOCK();
        (entry->tag).data.super_atomic<long>.super___atomic_base<long>._M_i = uVar7;
        UNLOCK();
        (entry->mutex).flag.super_atomic<bool>._M_base._M_i = false;
LAB_005b2c83:
        if (((This.ptr != 0) && ((ulong)(DAT_0220a4c0 + lVar5) <= local_98 + lVar5 + 7U)) &&
           (bVar2 = eval(local_a0,(Ref)This.ptr,&u_local,&v_local,1.0,0), plVar4 = local_a8, bVar2))
        {
          plVar3 = (long *)*local_a8;
          if (plVar3 == (long *)0x0) {
            SharedLazyTessellationCache::getNextRenderThreadWorkState
                      ((SharedLazyTessellationCache *)
                       &SharedLazyTessellationCache::sharedLazyTessellationCache);
            plVar3 = (long *)*plVar4;
          }
          LOCK();
          *plVar3 = *plVar3 + -1;
          UNLOCK();
          return;
        }
        plVar3 = local_a8;
        plVar4 = (long *)*local_a8;
        if (plVar4 == (long *)0x0) {
          SharedLazyTessellationCache::getNextRenderThreadWorkState
                    ((SharedLazyTessellationCache *)
                     &SharedLazyTessellationCache::sharedLazyTessellationCache);
          plVar4 = (long *)*plVar3;
        }
        LOCK();
        *plVar4 = *plVar4 + -1;
        UNLOCK();
        FeatureAdaptiveEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::FeatureAdaptiveEval
                  (&local_60,edge_local,vertices_local,stride_local,u_local,v_local,P,dPdu,dPdv,
                   ddPdudu,ddPdvdv,ddPdudv);
        return;
      }
      (this_00->flag).super_atomic<bool>._M_base._M_i = false;
    }
    LOCK();
    (t_state->counter).super___atomic_base<unsigned_long>._M_i =
         (t_state->counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
  } while( true );
}

Assistant:

PatchEval (SharedLazyTessellationCache::CacheEntry& entry, size_t commitCounter, 
                   const HalfEdge* edge, const char* vertices, size_t stride, const float u, const float v, 
                   Vertex* P, Vertex* dPdu, Vertex* dPdv, Vertex* ddPdudu, Vertex* ddPdvdv, Vertex* ddPdudv)
        : P(P), dPdu(dPdu), dPdv(dPdv), ddPdudu(ddPdudu), ddPdvdv(ddPdvdv), ddPdudv(ddPdudv)
        {
          /* conservative time for the very first allocation */
          auto time = SharedLazyTessellationCache::sharedLazyTessellationCache.getTime(commitCounter);

          Ref patch = SharedLazyTessellationCache::lookup(entry,commitCounter,[&] () {
              auto alloc = [&](size_t bytes) { return SharedLazyTessellationCache::malloc(bytes); };
              return Patch::create(alloc,edge,vertices,stride);
            },true);

          auto curTime = SharedLazyTessellationCache::sharedLazyTessellationCache.getTime(commitCounter);
          const bool allAllocationsValid = SharedLazyTessellationCache::validTime(time,curTime);

          if (patch && allAllocationsValid &&  eval(patch,u,v,1.0f,0)) {
            SharedLazyTessellationCache::unlock();
            return;
          }
          SharedLazyTessellationCache::unlock();
          FeatureAdaptiveEval<Vertex,Vertex_t>(edge,vertices,stride,u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv);
          PATCH_DEBUG_SUBDIVISION(edge,c,-1,-1);
        }